

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpOperations.cpp
# Opt level: O3

pointer __thiscall
gmlc::networking::establishConnection
          (networking *this,SocketFactory *sf,io_context *io_context,string *host,string *port,
          milliseconds timeOut)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  milliseconds mVar7;
  uint uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> this_00;
  pointer pVar9;
  TcpConnection *__tmp;
  TcpConnection *local_88;
  TcpConnection *local_78;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  element_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  SocketFactory *local_50;
  io_context *local_48;
  string *local_40;
  string *local_38;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_50 = sf;
  local_48 = io_context;
  local_40 = host;
  local_38 = port;
  pVar9 = TcpConnection::create
                    ((TcpConnection *)&stack0xffffffffffffff88,sf,io_context,host,port,0x27d0);
  this_00._M_pi = _Stack_70._M_pi;
  _Var6 = pVar9.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  local_88 = local_78;
  *(TcpConnection **)this = local_78;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Stack_70._M_pi;
  if (0 < timeOut.__r) {
    uVar8 = 1;
    local_60 = (element_type *)std::chrono::_V2::steady_clock::now();
    mVar7.__r = timeOut.__r;
    local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)timeOut.__r;
    while( true ) {
      bVar2 = TcpConnection::waitUntilConnected(local_88,timeOut);
      if (bVar2) break;
      lVar4 = std::chrono::_V2::steady_clock::now();
      _Var6._M_pi = SUB168(SEXT816(lVar4 - (long)local_60) * SEXT816(-0x431bde82d7b634db),8);
      lVar4 = (((long)_Var6._M_pi >> 0x12) - ((long)_Var6._M_pi >> 0x3f)) + (long)local_58._M_pi;
      if (1 < uVar8 && lVar4 < 0) {
        *(undefined8 *)this = 0;
        *(undefined8 *)(this + 8) = 0;
        if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
          _Var6._M_pi = extraout_RDX_00;
        }
        goto LAB_00419d54;
      }
      if (mVar7.__r - lVar4 < 100) {
        local_78 = (TcpConnection *)0x0;
        _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbebc200;
        do {
          iVar3 = nanosleep((timespec *)&stack0xffffffffffffff88,
                            (timespec *)&stack0xffffffffffffff88);
          if (iVar3 != -1) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
      }
      timeOut.__r = lVar4;
      if (lVar4 < 0) {
        timeOut.__r = 400;
      }
      TcpConnection::create
                ((TcpConnection *)&stack0xffffffffffffff88,local_50,local_48,local_40,local_38,
                 0x27d0);
      _Var1._M_pi = _Stack_70._M_pi;
      local_88 = local_78;
      local_78 = (TcpConnection *)0x0;
      _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
        }
      }
      uVar8 = uVar8 + 1;
      mVar7.__r = lVar4;
      this_00._M_pi = _Var1._M_pi;
    }
    *(TcpConnection **)this = local_88;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = this_00._M_pi;
    _Var6._M_pi = extraout_RDX;
  }
LAB_00419d54:
  pVar9.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var6._M_pi;
  pVar9.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (pointer)pVar9.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpConnection::pointer establishConnection(
    const SocketFactory& sf,
    asio::io_context& io_context,
    const std::string& host,
    const std::string& port,
    std::chrono::milliseconds timeOut)
{
    using std::chrono::milliseconds;
    using std::chrono::steady_clock;

    using namespace std::chrono_literals;  // NOLINT

    TcpConnection::pointer connectionPtr;
    connectionPtr = TcpConnection::create(sf, io_context, host, port);
    if (timeOut <= std::chrono::milliseconds(0)) {
        return connectionPtr;
    }

    auto tick = steady_clock::now();
    milliseconds timeRemaining(timeOut);
    milliseconds timeRemPrev(timeOut);
    int trycnt = 1;
    while (!connectionPtr->waitUntilConnected(timeRemaining)) {
        auto tock = steady_clock::now();
        timeRemaining = milliseconds(timeOut) -
            std::chrono::duration_cast<milliseconds>(tock - tick);
        if ((timeRemaining < 0ms) && (trycnt > 1)) {
            connectionPtr = nullptr;
            break;
        }
        // make sure we slow down and sleep for a little bit
        if (timeRemPrev - timeRemaining < 100ms) {
            std::this_thread::sleep_for(200ms);
        }
        timeRemPrev = timeRemaining;
        if (timeRemaining < 0ms) {
            timeRemaining = 400ms;
        }

        // lets try to connect again
        ++trycnt;
        connectionPtr = TcpConnection::create(sf, io_context, host, port);
    }
    return connectionPtr;
}